

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
cnn::LogGamma::forward_impl
          (LogGamma *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  Tensor *pTVar1;
  float *pfVar2;
  float *pfVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  float fVar9;
  int dummy;
  int local_2c;
  
  pTVar1 = *(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  uVar6 = (ulong)(pTVar1->d).nd;
  iVar4 = 1;
  iVar7 = 1;
  if (uVar6 != 0) {
    iVar7 = 1;
    uVar5 = 0;
    do {
      iVar7 = iVar7 * (pTVar1->d).d[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar6 != uVar5);
  }
  uVar8 = iVar7 * (pTVar1->d).bd;
  uVar6 = (ulong)(fx->d).nd;
  if (uVar6 != 0) {
    iVar4 = 1;
    uVar5 = 0;
    do {
      iVar4 = iVar4 * (fx->d).d[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar6 != uVar5);
  }
  if (iVar4 * (fx->d).bd == uVar8) {
    if ((ulong)uVar8 != 0) {
      pfVar2 = pTVar1->v;
      pfVar3 = fx->v;
      uVar6 = 0;
      do {
        fVar9 = lgammaf_r(pfVar2[uVar6],&local_2c);
        pfVar3[uVar6] = fVar9;
        uVar6 = uVar6 + 1;
      } while (uVar8 != uVar6);
    }
    return;
  }
  __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                "void Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float, -1, 1>>>::resize(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
               );
}

Assistant:

void Exp::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("Exp not yet implemented for CUDA");
#else
  fx.vec() = xs[0]->vec().array().exp();
#endif
}